

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O1

event_set * __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::serving,_unsigned_long>
::current_handled_events
          (event_set *__return_storage_ptr__,
          state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::serving,_unsigned_long>
          *this)

{
  current_events_table *pcVar1;
  available_transtions_table *paVar2;
  indexes_tuple<0UL,_1UL> local_12;
  indexes_tuple<0UL,_1UL> local_11;
  
  pcVar1 = state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,vending::vending_def::on::serving,unsigned_long>
           ::get_current_events_table<0ul,1ul>(&local_11);
  if (pcVar1->_M_elems[this->current_state_].super__Function_base._M_manager != (_Manager_type)0x0)
  {
    (**(code **)(((_Any_data *)(pcVar1->_M_elems + this->current_state_))->_M_pod_data + 0x18))
              (__return_storage_ptr__,(_Any_data *)(pcVar1->_M_elems + this->current_state_),
               &this->states_);
    paVar2 = state_transition_table<afsm::inner_state_machine<vending::vending_def::on::serving,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,vending::vending_def::on::serving,unsigned_long>
             ::get_available_transitions_table<0ul,1ul>(&local_12);
    std::
    _Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<afsm::detail::event_base::id_type_const*>>
              ((_Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
                *)__return_storage_ptr__,
               paVar2->_M_elems[this->current_state_]._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,(_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)
                       &paVar2->_M_elems[this->current_state_]._M_t._M_impl.super__Rb_tree_header);
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

event_set
    current_handled_events() const
    {
        auto const& table = get_current_events_table(state_indexes{});
        auto res = table[current_state_](states_);
        auto const& available_transitions
                            = get_available_transitions_table(state_indexes{});
        auto const& trans = available_transitions[current_state_];
        res.insert( trans.begin(), trans.end());
        return res;
    }